

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  bool bVar1;
  long lVar2;
  wchar_t *pwVar3;
  uint uVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *(ulong *)this;
  pwVar3 = *it + *(uint *)(this + 8);
  pwVar6 = pwVar3;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      uVar8 = (ulong)(uint)((int)uVar7 + (int)uVar5 * -100);
      pwVar6[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar8 * 2 + 1];
      pwVar6[-2] = (int)(char)internal::basic_data<void>::DIGITS[uVar8 * 2];
      pwVar6 = pwVar6 + -2;
      bVar1 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  if (uVar5 < 10) {
    uVar4 = (uint)uVar5 | 0x30;
    lVar2 = -4;
  }
  else {
    pwVar6[-1] = (int)(char)internal::basic_data<void>::DIGITS
                            [((uVar5 & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar4 = (uint)(char)internal::basic_data<void>::DIGITS[(uVar5 & 0xffffffff) * 2];
    lVar2 = -8;
  }
  *(uint *)((long)pwVar6 + lVar2) = uVar4;
  *it = pwVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }